

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O1

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index row,Index col)

{
  non_const_type pMVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  double *pdVar5;
  char *pcVar6;
  long lVar7;
  CoeffReturnType CVar8;
  
  pMVar1 = (this->m_lhs).m_matrix;
  pdVar2 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_data;
  lVar3 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows;
  if (lVar3 < 0 && pdVar2 != (double *)0x0) {
    pcVar6 = 
    "Eigen::MapBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>, Level = 0]"
    ;
LAB_00113a1d:
    __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/MapBase.h"
                  ,0xb0,pcVar6);
  }
  if ((row < 0) ||
     ((((this->m_lhs).m_matrix)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
      m_storage.m_cols <= row)) {
    pcVar6 = 
    "Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>::Block(XprType &, Index) [XprType = const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
    ;
  }
  else {
    pMVar1 = (this->m_rhs).m_matrix;
    pdVar5 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar4 = (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    if (lVar4 < 0 && pdVar5 != (double *)0x0) {
      pcVar6 = 
      "Eigen::MapBase<Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>, Level = 0]"
      ;
      goto LAB_00113a1d;
    }
    if ((-1 < col) &&
       (col < (((this->m_rhs).m_matrix)->
              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows)) {
      if (lVar3 != lVar4) {
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/CwiseBinaryOp.h"
                      ,0x6e,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, Rhs = const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>]"
                     );
      }
      if (lVar4 == 0) {
        CVar8 = 0.0;
      }
      else {
        if (lVar4 < 1) {
          __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Redux.h"
                        ,0x19d,
                        "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, 1, -1, true>>, const Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
                       );
        }
        pdVar2 = pdVar2 + lVar3 * row;
        CVar8 = *pdVar2 * pdVar5[col];
        if (lVar4 != 1) {
          lVar3 = (((this->m_rhs).m_matrix)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
          ;
          pdVar5 = pdVar5 + lVar3 + col;
          lVar7 = 1;
          do {
            CVar8 = CVar8 + pdVar2[lVar7] * *pdVar5;
            lVar7 = lVar7 + 1;
            pdVar5 = pdVar5 + lVar3;
          } while (lVar4 != lVar7);
        }
      }
      return CVar8;
    }
    pcVar6 = 
    "Eigen::Block<const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, -1, 1>::Block(XprType &, Index) [XprType = const Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
    ;
  }
  __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/haukri[P]MasterProject/Eigen/src/Core/Block.h"
                ,0x7a,pcVar6);
}

Assistant:

const CoeffReturnType coeff(Index row, Index col) const
  {
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }